

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

void Bmc_CexTest(Gia_Man_t *p,Abc_Cex_t *pCex,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Abc_Cex_t *pCexState;
  Abc_Cex_t *pCexCare_00;
  abctime aVar3;
  abctime time;
  Abc_Cex_t *pCexImpl;
  Abc_Cex_t *pCexMin;
  Abc_Cex_t *pCexEss;
  Abc_Cex_t *pCexCare;
  Abc_Cex_t *pCexStates;
  
  aVar2 = Abc_Clock();
  pCexImpl = (Abc_Cex_t *)0x0;
  pCexState = Bmc_CexInnerStates(p,pCex,&pCexImpl,fVerbose);
  pCexStates = pCexState;
  pCexCare_00 = Bmc_CexCareBits(p,pCexState,pCexImpl,(Abc_Cex_t *)0x0,1,fVerbose);
  pCexCare = pCexCare_00;
  iVar1 = Bmc_CexVerify(p,pCex,pCexCare_00);
  if (iVar1 == 0) {
    puts("Counter-example care-set verification has failed.");
  }
  pCexEss = Bmc_CexEssentialBits(p,pCexState,pCexCare_00,fVerbose);
  pCexMin = Bmc_CexCareBits(p,pCexState,pCexImpl,pCexEss,0,fVerbose);
  iVar1 = Bmc_CexVerify(p,pCex,pCexMin);
  if (iVar1 == 0) {
    puts("Counter-example min-set verification has failed.");
  }
  Abc_CexFreeP(&pCexStates);
  Abc_CexFreeP(&pCexImpl);
  Abc_CexFreeP(&pCexCare);
  Abc_CexFreeP(&pCexEss);
  Abc_CexFreeP(&pCexMin);
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar2,(char *)pCex,time);
  return;
}

Assistant:

void Bmc_CexTest( Gia_Man_t * p, Abc_Cex_t * pCex, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Cex_t * pCexImpl   = NULL;
    Abc_Cex_t * pCexStates = Bmc_CexInnerStates( p, pCex, &pCexImpl, fVerbose );
    Abc_Cex_t * pCexCare   = Bmc_CexCareBits( p, pCexStates, pCexImpl, NULL, 1, fVerbose );
    Abc_Cex_t * pCexEss, * pCexMin;

    if ( !Bmc_CexVerify( p, pCex, pCexCare ) )
        printf( "Counter-example care-set verification has failed.\n" );

    pCexEss = Bmc_CexEssentialBits( p, pCexStates, pCexCare, fVerbose );
    pCexMin = Bmc_CexCareBits( p, pCexStates, pCexImpl, pCexEss, 0, fVerbose );

    if ( !Bmc_CexVerify( p, pCex, pCexMin ) )
        printf( "Counter-example min-set verification has failed.\n" );

//    Bmc_CexDumpStats( p, pCex, pCexCare, pCexEss, pCexMin, Abc_Clock() - clk );

    Abc_CexFreeP( &pCexStates );
    Abc_CexFreeP( &pCexImpl );
    Abc_CexFreeP( &pCexCare );
    Abc_CexFreeP( &pCexEss );
    Abc_CexFreeP( &pCexMin );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Bmc_CexBuildNetworkTest( p, pCex );
//    Bmc_CexPerformUnrollingTest( p, pCex );
}